

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall pybind11::iterator::iterator(iterator *this,object *o)

{
  int iVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_31;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  (this->super_object).super_handle.m_ptr = (o->super_handle).m_ptr;
  (o->super_handle).m_ptr = (PyObject *)0x0;
  (this->value).super_handle.m_ptr = (PyObject *)0x0;
  if ((this->super_object).super_handle.m_ptr != (PyObject *)0x0) {
    iVar1 = PyIter_Check();
    if (iVar1 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,((this->super_object).super_handle.m_ptr)->ob_type->tp_name,
                 &local_31);
      std::operator+(&local_98,"Object of type \'",&local_58);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
      local_78 = (long *)*plVar2;
      plVar3 = plVar2 + 2;
      if (local_78 == plVar3) {
        local_68 = *plVar3;
        lStack_60 = plVar2[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar3;
      }
      local_70 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_78);
      *(undefined ***)this_00 = &PTR__runtime_error_004c1c78;
      __cxa_throw(this_00,&type_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

iterator& operator++() {
        advance();
        return *this;
    }